

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O1

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitTableInit
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,TableInit *curr)

{
  ExternalInterface *pEVar1;
  uint uVar2;
  uint64_t uVar3;
  size_type sVar4;
  ulong uVar5;
  ulong uVar6;
  undefined1 local_1a0 [8];
  Literal value;
  Literal local_180;
  vector<wasm::Literal,_std::allocator<wasm::Literal>_> local_168;
  undefined1 local_140 [8];
  Flow dest;
  Flow offset;
  Flow size;
  undefined1 local_60 [8];
  TableInstanceInfo info;
  
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)local_140,&this->super_ExpressionRunner<wasm::ModuleRunner>,curr->dest);
  if (dest.breakTo.super_IString.str._M_len == 0) {
    ExpressionRunner<wasm::ModuleRunner>::visit
              ((Flow *)&dest.breakTo.super_IString.str._M_str,
               &this->super_ExpressionRunner<wasm::ModuleRunner>,curr->offset);
    if (offset.breakTo.super_IString.str._M_len == 0) {
      ExpressionRunner<wasm::ModuleRunner>::visit
                ((Flow *)&offset.breakTo.super_IString.str._M_str,
                 &this->super_ExpressionRunner<wasm::ModuleRunner>,curr->size);
      if (size.breakTo.super_IString.str._M_len == 0) {
        info.name.super_IString.str._M_str =
             (char *)Module::getElementSegment(this->wasm,(Name)(curr->segment).super_IString.str);
        if (((long)((long)dest.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                          super__Vector_impl_data._M_start -
                   dest.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id) >> 3
            ) * -0x5555555555555555 + (long)local_140 != 1) {
LAB_00d33f51:
          __assert_fail("values.size() == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                        ,0x52,"const Literal &wasm::Flow::getSingleValue()");
        }
        uVar3 = Literal::getUnsigned((Literal *)&dest);
        if (dest.breakTo.super_IString.str._M_str +
            ((long)((long)offset.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                          super__Vector_impl_data._M_start -
                   offset.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id) >>
            3) * -0x5555555555555555 != (char *)0x1) goto LAB_00d33f51;
        if (offset.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.
            super_IString.str._M_str != (char *)0x2) {
LAB_00d33f70:
          __assert_fail("type == Type::i32",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                        ,0x120,"int32_t wasm::Literal::geti32() const");
        }
        if (offset.breakTo.super_IString.str._M_str +
            ((long)((long)size.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                          super__Vector_impl_data._M_start -
                   size.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id) >> 3
            ) * -0x5555555555555555 != (char *)0x1) goto LAB_00d33f51;
        if (size.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.
            super_IString.str._M_str != (char *)0x2) goto LAB_00d33f70;
        uVar6 = (ulong)(uint)offset.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed;
        uVar5 = (ulong)(uint)size.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed;
        if (uVar6 + uVar5 != 0) {
          sVar4 = std::
                  _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::count(&(this->droppedElementSegments)._M_h,&curr->segment);
          if (sVar4 != 0) {
            (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[2])
                      (this,"out of bounds segment access in table.init");
          }
        }
        if ((ulong)(*(long *)(info.name.super_IString.str._M_str + 0x40) -
                    *(long *)(info.name.super_IString.str._M_str + 0x38) >> 3) < uVar6 + uVar5) {
          (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[2])
                    (this,"out of bounds segment access in table.init");
        }
        size.breakTo.super_IString.str._M_str = (char *)__return_storage_ptr__;
        getTableInstanceInfo
                  ((TableInstanceInfo *)local_60,this,(Name)(curr->table).super_IString.str);
        pEVar1 = ((ModuleRunnerBase<wasm::ModuleRunner> *)local_60)->externalInterface;
        uVar2 = (*pEVar1->_vptr_ExternalInterface[0x1b])
                          (pEVar1,info.instance,info.name.super_IString.str._M_len);
        if ((ulong)uVar2 < uVar3 + uVar5) {
          (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[2])
                    (this,"out of bounds table access in table.init");
        }
        if (uVar5 != 0) {
          do {
            ExpressionRunner<wasm::ModuleRunner>::visit
                      ((Flow *)&value.type,&this->super_ExpressionRunner<wasm::ModuleRunner>,
                       *(Expression **)
                        (*(long *)(info.name.super_IString.str._M_str + 0x38) + uVar6 * 8));
            if (((long)local_168.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_168.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 +
                value.type.id != 1) goto LAB_00d33f51;
            Literal::Literal((Literal *)local_1a0,&local_180);
            std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(&local_168);
            Literal::~Literal(&local_180);
            pEVar1 = ((ModuleRunnerBase<wasm::ModuleRunner> *)local_60)->externalInterface;
            (*pEVar1->_vptr_ExternalInterface[0x1c])
                      (pEVar1,info.instance,info.name.super_IString.str._M_len,uVar3,
                       (Literal *)local_1a0);
            Literal::~Literal((Literal *)local_1a0);
            uVar3 = uVar3 + 1;
            uVar6 = uVar6 + 1;
            uVar5 = uVar5 - 1;
          } while (uVar5 != 0);
        }
        size.breakTo.super_IString.str._M_str[0x30] = '\0';
        size.breakTo.super_IString.str._M_str[0x31] = '\0';
        size.breakTo.super_IString.str._M_str[0x32] = '\0';
        size.breakTo.super_IString.str._M_str[0x33] = '\0';
        size.breakTo.super_IString.str._M_str[0x34] = '\0';
        size.breakTo.super_IString.str._M_str[0x35] = '\0';
        size.breakTo.super_IString.str._M_str[0x36] = '\0';
        size.breakTo.super_IString.str._M_str[0x37] = '\0';
        size.breakTo.super_IString.str._M_str[0x38] = '\0';
        size.breakTo.super_IString.str._M_str[0x39] = '\0';
        size.breakTo.super_IString.str._M_str[0x3a] = '\0';
        size.breakTo.super_IString.str._M_str[0x3b] = '\0';
        size.breakTo.super_IString.str._M_str[0x3c] = '\0';
        size.breakTo.super_IString.str._M_str[0x3d] = '\0';
        size.breakTo.super_IString.str._M_str[0x3e] = '\0';
        size.breakTo.super_IString.str._M_str[0x3f] = '\0';
        size.breakTo.super_IString.str._M_str[0x20] = '\0';
        size.breakTo.super_IString.str._M_str[0x21] = '\0';
        size.breakTo.super_IString.str._M_str[0x22] = '\0';
        size.breakTo.super_IString.str._M_str[0x23] = '\0';
        size.breakTo.super_IString.str._M_str[0x24] = '\0';
        size.breakTo.super_IString.str._M_str[0x25] = '\0';
        size.breakTo.super_IString.str._M_str[0x26] = '\0';
        size.breakTo.super_IString.str._M_str[0x27] = '\0';
        size.breakTo.super_IString.str._M_str[0x28] = '\0';
        size.breakTo.super_IString.str._M_str[0x29] = '\0';
        size.breakTo.super_IString.str._M_str[0x2a] = '\0';
        size.breakTo.super_IString.str._M_str[0x2b] = '\0';
        size.breakTo.super_IString.str._M_str[0x2c] = '\0';
        size.breakTo.super_IString.str._M_str[0x2d] = '\0';
        size.breakTo.super_IString.str._M_str[0x2e] = '\0';
        size.breakTo.super_IString.str._M_str[0x2f] = '\0';
        size.breakTo.super_IString.str._M_str[0x10] = '\0';
        size.breakTo.super_IString.str._M_str[0x11] = '\0';
        size.breakTo.super_IString.str._M_str[0x12] = '\0';
        size.breakTo.super_IString.str._M_str[0x13] = '\0';
        size.breakTo.super_IString.str._M_str[0x14] = '\0';
        size.breakTo.super_IString.str._M_str[0x15] = '\0';
        size.breakTo.super_IString.str._M_str[0x16] = '\0';
        size.breakTo.super_IString.str._M_str[0x17] = '\0';
        size.breakTo.super_IString.str._M_str[0x18] = '\0';
        size.breakTo.super_IString.str._M_str[0x19] = '\0';
        size.breakTo.super_IString.str._M_str[0x1a] = '\0';
        size.breakTo.super_IString.str._M_str[0x1b] = '\0';
        size.breakTo.super_IString.str._M_str[0x1c] = '\0';
        size.breakTo.super_IString.str._M_str[0x1d] = '\0';
        size.breakTo.super_IString.str._M_str[0x1e] = '\0';
        size.breakTo.super_IString.str._M_str[0x1f] = '\0';
        size.breakTo.super_IString.str._M_str[0] = '\0';
        size.breakTo.super_IString.str._M_str[1] = '\0';
        size.breakTo.super_IString.str._M_str[2] = '\0';
        size.breakTo.super_IString.str._M_str[3] = '\0';
        size.breakTo.super_IString.str._M_str[4] = '\0';
        size.breakTo.super_IString.str._M_str[5] = '\0';
        size.breakTo.super_IString.str._M_str[6] = '\0';
        size.breakTo.super_IString.str._M_str[7] = '\0';
        size.breakTo.super_IString.str._M_str[8] = '\0';
        size.breakTo.super_IString.str._M_str[9] = '\0';
        size.breakTo.super_IString.str._M_str[10] = '\0';
        size.breakTo.super_IString.str._M_str[0xb] = '\0';
        size.breakTo.super_IString.str._M_str[0xc] = '\0';
        size.breakTo.super_IString.str._M_str[0xd] = '\0';
        size.breakTo.super_IString.str._M_str[0xe] = '\0';
        size.breakTo.super_IString.str._M_str[0xf] = '\0';
        size.breakTo.super_IString.str._M_str[0x40] = '\0';
        size.breakTo.super_IString.str._M_str[0x41] = '\0';
        size.breakTo.super_IString.str._M_str[0x42] = '\0';
        size.breakTo.super_IString.str._M_str[0x43] = '\0';
        size.breakTo.super_IString.str._M_str[0x44] = '\0';
        size.breakTo.super_IString.str._M_str[0x45] = '\0';
        size.breakTo.super_IString.str._M_str[0x46] = '\0';
        size.breakTo.super_IString.str._M_str[0x47] = '\0';
        __return_storage_ptr__ = (Flow *)size.breakTo.super_IString.str._M_str;
      }
      else {
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
             (size_t)offset.breakTo.super_IString.str._M_str;
        Literal::Literal((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.
                         fixed._M_elems,(Literal *)&size);
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)size.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_finish =
             size.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
             super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
             super__Vector_impl_data._M_start;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             size.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
             super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
             super__Vector_impl_data._M_finish;
        size.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
        size.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        size.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->breakTo).super_IString.str._M_len =
             (size_t)size.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                     super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
        (__return_storage_ptr__->breakTo).super_IString.str._M_str =
             (char *)size.breakTo.super_IString.str._M_len;
      }
      std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
                 &size.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
      Literal::~Literal((Literal *)&size);
    }
    else {
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
           (size_t)dest.breakTo.super_IString.str._M_str;
      Literal::Literal((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                       _M_elems,(Literal *)&offset);
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)offset.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish =
           offset.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
           super__Vector_impl_data._M_start;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           offset.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
           super__Vector_impl_data._M_finish;
      offset.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
      offset.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      offset.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->breakTo).super_IString.str._M_len =
           (size_t)offset.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                   super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
      (__return_storage_ptr__->breakTo).super_IString.str._M_str =
           (char *)offset.breakTo.super_IString.str._M_len;
    }
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
              ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
               &offset.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
    Literal::~Literal((Literal *)&offset);
  }
  else {
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
         (size_t)local_140;
    Literal::Literal((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                     _M_elems,(Literal *)&dest);
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)dest.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish =
         dest.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         dest.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_finish;
    dest.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
    dest.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    dest.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->breakTo).super_IString.str._M_len =
         (size_t)dest.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                 super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->breakTo).super_IString.str._M_str =
         (char *)dest.breakTo.super_IString.str._M_len;
  }
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
            ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
             &dest.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
  Literal::~Literal((Literal *)&dest);
  return __return_storage_ptr__;
}

Assistant:

Flow visitTableInit(TableInit* curr) {
    NOTE_ENTER("TableInit");
    Flow dest = self()->visit(curr->dest);
    if (dest.breaking()) {
      return dest;
    }
    Flow offset = self()->visit(curr->offset);
    if (offset.breaking()) {
      return offset;
    }
    Flow size = self()->visit(curr->size);
    if (size.breaking()) {
      return size;
    }
    NOTE_EVAL1(dest);
    NOTE_EVAL1(offset);
    NOTE_EVAL1(size);

    auto* segment = wasm.getElementSegment(curr->segment);

    Address destVal(dest.getSingleValue().getUnsigned());
    Address offsetVal(uint32_t(offset.getSingleValue().geti32()));
    Address sizeVal(uint32_t(size.getSingleValue().geti32()));

    if (offsetVal + sizeVal > 0 &&
        droppedElementSegments.count(curr->segment)) {
      trap("out of bounds segment access in table.init");
    }
    if (offsetVal + sizeVal > segment->data.size()) {
      trap("out of bounds segment access in table.init");
    }
    auto info = getTableInstanceInfo(curr->table);
    auto tableSize = info.interface()->tableSize(info.name);
    if (destVal + sizeVal > tableSize) {
      trap("out of bounds table access in table.init");
    }
    for (size_t i = 0; i < sizeVal; ++i) {
      // FIXME: We should not call visit() here more than once at runtime. The
      //        values in the segment should be computed once during startup,
      //        and then read here as needed. For example, if we had a
      //        struct.new here then we should not allocate a new struct each
      //        time we table.init that data.
      auto value = self()->visit(segment->data[offsetVal + i]).getSingleValue();
      info.interface()->tableStore(info.name, destVal + i, value);
    }
    return {};
  }